

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::StructType::~StructType(StructType *this)

{
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__StructType_00182fb0;
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::~vector(&this->fields);
  TypeEntry::~TypeEntry(&this->super_TypeEntry);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Struct;
  }